

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall sqlite_orm::internal::storage_base::on_open_internal(storage_base *this,sqlite3 *db)

{
  error_code __ec;
  bool bVar1;
  int iVar2;
  system_error *this_00;
  iterator __what;
  undefined8 uVar3;
  undefined8 uVar4;
  error_category *__cat;
  reference ppVar5;
  pointer this_01;
  sqlite3 *psVar6;
  undefined8 in_RSI;
  long in_RDI;
  pair<const_int,_int> *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>
  *p;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>_>
  *__range2;
  bool in_stack_00000127;
  sqlite3 *in_stack_00000128;
  storage_base *in_stack_00000130;
  sqlite3 *in_stack_00000148;
  journal_mode *in_stack_00000150;
  string *in_stack_00000158;
  pragma_t *in_stack_00000160;
  sqlite3 *in_stack_ffffffffffffff28;
  function<void_(sqlite3_*)> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff68;
  _Self in_stack_ffffffffffffff70;
  _Self local_88;
  long local_80;
  error_code local_78;
  reference local_68;
  _Self local_60;
  int in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc [12];
  allocator<char> local_31;
  string local_30 [32];
  undefined8 local_10;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_10 = in_RSI;
  if (*(int *)(in_RDI + 0xd8) != 0) {
    foreign_keys(in_stack_00000130,in_stack_00000128,in_stack_00000127);
  }
  if (*(int *)(in_RDI + 0x20) != -1) {
    pragma_t::synchronous((pragma_t *)in_stack_ffffffffffffff70._M_node,iVar2);
  }
  if (*(char *)(in_RDI + 0x24) != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_30,"journal_mode",&local_31);
    in_stack_ffffffffffffffb8 =
         CONCAT13(*(undefined1 *)(in_RDI + 0x24),(int3)in_stack_ffffffffffffffb8);
    pragma_t::set_pragma(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  this_00 = (system_error *)(in_RDI + 0xa8);
  __what = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>_>
                    *)in_stack_ffffffffffffff28);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>_>
              *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa8,&local_60);
    if (!bVar1) {
      local_80 = in_RDI + 0x68;
      local_88._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_ffffffffffffff28);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_ffffffffffffff28);
      while (bVar1 = std::operator!=(&local_88,(_Self *)&stack0xffffffffffffff70), bVar1) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)
                            in_stack_ffffffffffffff30);
        sqlite3_limit(local_10,ppVar5->first,ppVar5->second);
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_ffffffffffffff30);
      }
      bVar1 = std::function::operator_cast_to_bool((function<int_(int)> *)0x200ba3);
      if (bVar1) {
        this_01 = std::
                  unique_ptr<sqlite_orm::internal::connection_holder,_std::default_delete<sqlite_orm::internal::connection_holder>_>
                  ::operator->((unique_ptr<sqlite_orm::internal::connection_holder,_std::default_delete<sqlite_orm::internal::connection_holder>_>
                                *)0x200bba);
        psVar6 = connection_holder::get(this_01);
        sqlite3_busy_handler(psVar6,busy_handler_callback,in_RDI);
      }
      bVar1 = std::function::operator_cast_to_bool((function<void_(sqlite3_*)> *)0x200be0);
      if (bVar1) {
        std::function<void_(sqlite3_*)>::operator()
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      return;
    }
    local_68 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>
                            *)in_stack_ffffffffffffff30);
    uVar4 = local_10;
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = sqlite3_create_collation(uVar4,uVar3,1,&local_68->second,collate_callback);
    if (iVar2 != 0) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<int_(int,_const_void_*,_int,_const_void_*)>_>_>
                  *)in_stack_ffffffffffffff30);
  }
  uVar4 = __cxa_allocate_exception(0x20);
  iVar2 = sqlite3_errcode(local_10);
  __cat = &get_sqlite_error_category()->super_error_category;
  std::error_code::error_code(&local_78,iVar2,__cat);
  sqlite3_errmsg(local_10);
  __ec._4_12_ = in_stack_ffffffffffffffbc;
  __ec._M_value = in_stack_ffffffffffffffb8;
  std::system_error::system_error(this_00,__ec,(char *)__what._M_node);
  __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void on_open_internal(sqlite3 *db) {

#if SQLITE_VERSION_NUMBER >= 3006019
        if(this->cachedForeignKeysCount) {
            this->foreign_keys(db, true);
        }
#endif
        if(this->pragma._synchronous != -1) {
            this->pragma.synchronous(this->pragma._synchronous);
        }

        if(this->pragma._journal_mode != -1) {
            this->pragma.set_pragma("journal_mode", static_cast<journal_mode>(this->pragma._journal_mode), db);
        }

        for(auto &p: this->collatingFunctions) {
            if(sqlite3_create_collation(db, p.first.c_str(), SQLITE_UTF8, &p.second, collate_callback) !=
               SQLITE_OK) {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        }

        for(auto &p: this->limit.limits) {
            sqlite3_limit(db, p.first, p.second);
        }

        if(_busy_handler) {
            sqlite3_busy_handler(this->connection->get(), busy_handler_callback, this);
        }

        if(this->on_open) {
            this->on_open(db);
        }
    }